

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssertBase *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  uint64_t uVar3;
  int iVar4;
  ostream *poVar5;
  string_view sVar6;
  undefined1 local_58 [8];
  shared_ptr<kratos::AssertPropertyStmt> st;
  
  iVar4 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])(stmt);
  if (iVar4 == 0) {
    puVar1 = &(this->stream_).super_stringstream.field_0x10;
    sVar6 = indent(this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"assert (",8);
    Stream::var_str_abi_cxx11_
              ((string *)local_58,&this->stream_,(Var *)stmt[1].super_Stmt.super_IRNode._vptr_IRNode
              );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT71(local_58._1_7_,local_58[0]),
                        (long)st.
                              super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_58._1_7_,local_58[0]) !=
        &st.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]),
                      (ulong)((long)&(st.
                                      super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if (stmt[1].super_Stmt.super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,";",1);
      puVar2 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar2 = *(long *)puVar2 + 1;
      local_58[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,local_58,1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," else ",6);
      uVar3 = this->indent_;
      this->indent_ = 0;
      (**this->_vptr_SystemVerilogCodeGen)
                (this,stmt[1].super_Stmt.super_IRNode.fn_name_ln.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      this->indent_ = uVar3;
    }
  }
  else {
    Stmt::as<kratos::AssertPropertyStmt>((Stmt *)local_58);
    stmt_code(this,(AssertPropertyStmt *)CONCAT71(local_58._1_7_,local_58[0]));
    if (st.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 st.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssertBase* stmt) {
    if (stmt->assert_type() == AssertType::AssertValue) {
        auto* st = reinterpret_cast<AssertValueStmt*>(stmt);
        stream_ << indent() << "assert (" << stream_.var_str(st->value()) << ")";
        if (st->else_()) {
            stream_ << " else ";
            // turn off the indent
            auto temp = indent_;
            indent_ = 0;
            dispatch_node(st->else_().get());
            indent_ = temp;
            // dispatch code will close the ;
        } else {
            stream_ << ";" << stream_.endl();
        }
    } else {
        auto st = stmt->as<AssertPropertyStmt>();
        stmt_code(st.get());
    }
}